

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::
async_upload_impl<(cinatra::upload_type_t)1,std::__cxx11::string,std::shared_ptr<std::ifstream>>
          (coro_http_client *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *uri,http_method method,
          shared_ptr<std::basic_ifstream<char,_std::char_traits<char>_>_> *source,
          req_content_type content_type,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers,uint64_t offset,int64_t content_length)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char *pcVar6;
  element_type *peVar7;
  string_view *psVar8;
  undefined4 in_register_00000014;
  long *plVar9;
  undefined4 in_register_00000084;
  
  plVar9 = (long *)CONCAT44(in_register_00000014,method);
  puVar2 = (undefined8 *)CONCAT44(in_register_00000084,content_type);
  peVar7 = (element_type *)operator_new(0x350,(nothrow_t *)&std::nothrow);
  if (peVar7 == (element_type *)0x0) {
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(code **)&(peVar7->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
               super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> =
         async_upload_impl<(cinatra::upload_type_t)1,std::__cxx11::string,std::shared_ptr<std::ifstream>>
    ;
    ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(peVar7->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
            super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         async_upload_impl<(cinatra::upload_type_t)1,std::__cxx11::string,std::shared_ptr<std::ifstream>>
    ;
    *(int *)((long)(peVar7->parser_).headers_._M_elems + 0x2fc) = (int)headers;
    *(int *)((long)(peVar7->parser_).headers_._M_elems + 0x2f8) = (int)source;
    ((string_view *)((long)(peVar7->parser_).headers_._M_elems + 0x2f0))->_M_len = (size_t)uri;
    psVar8 = (string_view *)((long)(peVar7->parser_).headers_._M_elems + 0x230);
    (((http_header *)((long)(peVar7->parser_).headers_._M_elems + 0x220))->name)._M_len =
         (size_t)psVar8;
    psVar1 = (size_t *)(plVar9 + 2);
    if ((size_t *)*plVar9 == psVar1) {
      pcVar6 = (char *)plVar9[3];
      psVar8->_M_len = *psVar1;
      *(char **)((long)(peVar7->parser_).headers_._M_elems + 0x238) = pcVar6;
    }
    else {
      (((http_header *)((long)(peVar7->parser_).headers_._M_elems + 0x220))->name)._M_len =
           (size_t)*plVar9;
      ((string_view *)((long)(peVar7->parser_).headers_._M_elems + 0x230))->_M_len = *psVar1;
    }
    *(char **)((long)(peVar7->parser_).headers_._M_elems + 0x228) = (char *)plVar9[1];
    *plVar9 = (long)psVar1;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    *(char **)((long)(peVar7->parser_).headers_._M_elems + 0x2a8) = (char *)0x0;
    uVar3 = *(undefined4 *)((long)puVar2 + 4);
    uVar4 = *(undefined4 *)(puVar2 + 1);
    uVar5 = *(undefined4 *)((long)puVar2 + 0xc);
    puVar2[1] = 0;
    *(undefined4 *)
     &(((http_header *)((long)(peVar7->parser_).headers_._M_elems + 0x2a0))->name)._M_len =
         *(undefined4 *)puVar2;
    *(undefined4 *)((long)(peVar7->parser_).headers_._M_elems + 0x2a4) = uVar3;
    *(undefined4 *)((long)(peVar7->parser_).headers_._M_elems + 0x2a8) = uVar4;
    *(undefined4 *)((long)(peVar7->parser_).headers_._M_elems + 0x2ac) = uVar5;
    *puVar2 = 0;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)(peVar7->parser_).headers_._M_elems + 0x178),offset);
    (peVar7->parser_).msg_._M_str = (char *)0x0;
    *(undefined8 *)&peVar7->parser_ = 0;
    (peVar7->parser_).msg_._M_len = 0;
    *(undefined1 *)((long)(peVar7->parser_).headers_._M_elems + 0x18) = 0;
    (this->super_enable_shared_from_this<cinatra::coro_http_client>)._M_weak_this.
    super___weak_ptr<cinatra::coro_http_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar7;
    *(undefined1 *)
     &(((http_header *)((long)(peVar7->parser_).headers_._M_elems + 0x300))->name)._M_len = 0;
  }
  return (Lazy<cinatra::resp_data>)this;
}

Assistant:

async_simple::coro::Lazy<resp_data> async_upload_impl(
      S uri, http_method method, Source source /* file */,
      req_content_type content_type = req_content_type::text,
      std::unordered_map<std::string, std::string> headers = {},
      uint64_t offset = 0 /*file offset*/,
      int64_t content_length = -1 /*upload size*/) {
    std::error_code ec{};
    size_t size = 0;
    bool is_keep_alive = true;
    req_context<> ctx{content_type};
    resp_data data{};

    out_buf_ = {};

    std::shared_ptr<void> guard(nullptr, [&, this](auto) {
      if (!req_headers_.empty()) {
        req_headers_.clear();
      }
    });

    auto [ok, u] = handle_uri(data, uri);
    if (!ok) {
      co_return resp_data{std::make_error_code(std::errc::protocol_error), 404};
    }

    if constexpr (upload_type != upload_type_t::multipart) {
      check_source(data, source);
      if (data.status != 0) {
        co_return data;
      }
    }

    if constexpr (upload_type == upload_type_t::with_length) {
      content_length = handle_upload_header_with_length(data, source, headers,
                                                        offset, content_length);
      if (data.status != 0) {
        co_return data;
      }
    }
    else if constexpr (upload_type == upload_type_t::chunked) {
      handle_upload_header_with_chunked(headers);
    }
    else if constexpr (upload_type == upload_type_t::multipart) {
      handle_upload_header_with_multipart();
    }

    std::string header_str =
        build_request_header(u, method, ctx, true, std::move(headers));

    if (socket_->has_closed_) {
      if (bool r = co_await reconnect(data, u); !r) {
        co_return data;
      }
    }

    auto time_guard = timer_guard(this, req_timeout_duration_, "request timer");
    std::tie(ec, size) = co_await async_write(asio::buffer(header_str));
    if (ec) {
      handle_upload_timeout_error(ec);
      co_return resp_data{ec, 404};
    }

    constexpr bool is_stream_file = is_stream_ptr_v<Source>;
    if constexpr (is_stream_file) {
      if constexpr (upload_type == upload_type_t::with_length) {
        co_await send_fstream_with_length(source, ec, offset, content_length);
      }
      else if constexpr (upload_type == upload_type_t::chunked) {
        co_await send_fstream_with_chunked(source, ec);
      }
    }
    else if constexpr (std::is_enum_v<Source>) {  // only for multipart
      co_await send_fstream_with_multipart(ec);
    }
    else if constexpr (std::is_same_v<Source, std::string> ||
                       std::is_same_v<Source, std::string_view>) {
#ifdef __linux__
#ifdef CINATRA_ENABLE_SSL
      if (!has_init_ssl_) {
#endif
        if constexpr (upload_type == upload_type_t::with_length) {
          co_await send_file_no_copy_with_length(std::filesystem::path{source},
                                                 ec, content_length, offset);
        }
        else if constexpr (upload_type == upload_type_t::chunked) {
          co_await send_file_no_copy_with_chunked(std::filesystem::path{source},
                                                  ec);
        }
#ifdef CINATRA_ENABLE_SSL
      }
      else {
        if constexpr (upload_type == upload_type_t::with_length) {
          co_await send_file_copy_with_length(source, ec, content_length,
                                              offset);
        }
        else if constexpr (upload_type == upload_type_t::chunked) {
          co_await send_file_copy_with_chunked(source, ec);
        }
      }
#endif
#else
      if constexpr (upload_type == upload_type_t::with_length) {
        co_await send_file_copy_with_length(source, ec, content_length, offset);
      }
      else if constexpr (upload_type == upload_type_t::chunked) {
        co_await send_file_copy_with_chunked(source, ec);
      }
#endif
    }
    else {
      if constexpr (upload_type == upload_type_t::with_length) {
        co_await send_sink_with_length(source, ec, content_length);
      }
      else if constexpr (upload_type == upload_type_t::chunked) {
        co_await send_sink_with_chunked(source, ec);
      }
    }
    if (ec) {
      handle_upload_timeout_error(ec);
      co_return resp_data{ec, 404};
    }

    data = co_await handle_read(ec, size, is_keep_alive, std::move(ctx),
                                http_method::POST);
    if (ec) {
      handle_upload_timeout_error(ec);
    }
    handle_result(data, ec, is_keep_alive);
    co_return data;
  }